

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O0

void __thiscall VgaDebugGenerator::ProcessModules(VgaDebugGenerator *this,string *name)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference name_00;
  mapped_type *pmVar3;
  reference __args;
  Wire *wire;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Wire,_std::allocator<Wire>_> *__range2;
  mapped_type *submodule;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *submodule_name;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  mapped_type *module;
  string *name_local;
  VgaDebugGenerator *this_local;
  
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
           ::operator[](&this->modules,name);
  std::vector<Wire,_std::allocator<Wire>_>::operator=(&pmVar2->wires_all,&pmVar2->wires);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pmVar2->submodule_names);
  submodule_name =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&pmVar2->submodule_names);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&submodule_name);
    if (!bVar1) break;
    name_00 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
    ProcessModules(this,name_00);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
             ::operator[](&this->modules,name_00);
    __end2 = std::vector<Wire,_std::allocator<Wire>_>::begin(&pmVar3->wires_all);
    wire = (Wire *)std::vector<Wire,_std::allocator<Wire>_>::end(&pmVar3->wires_all);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_Wire_*,_std::vector<Wire,_std::allocator<Wire>_>_>
                                  *)&wire);
      if (!bVar1) break;
      __args = __gnu_cxx::__normal_iterator<const_Wire_*,_std::vector<Wire,_std::allocator<Wire>_>_>
               ::operator*(&__end2);
      std::vector<Wire,std::allocator<Wire>>::emplace_back<Wire_const&>
                ((vector<Wire,std::allocator<Wire>> *)&pmVar2->wires_all,__args);
      __gnu_cxx::__normal_iterator<const_Wire_*,_std::vector<Wire,_std::allocator<Wire>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void VgaDebugGenerator::ProcessModules(const std::string &name) {
    auto &module = modules[name];
    module.wires_all = module.wires;

    for (const auto &submodule_name : module.submodule_names) {
        ProcessModules(submodule_name);
        const auto &submodule = modules[submodule_name];
        for (const auto &wire : submodule.wires_all) {
            module.wires_all.emplace_back(wire);
        }
    }
}